

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::binary_raw
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  uint address;
  ofstream file;
  
  std::ofstream::ofstream(&file,file_name,_S_out);
  for (address = lower_address + byte_order; address < higher_address; address = address + word_size
      ) {
    Memory_space::read8((Memory_space *)memory,address);
    std::ostream::put((char)&file);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void Sections::binary_raw(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		for (auto address = lower_address + byte_order; address < higher_address; ) {
			uint8_t c = memory.read8(address);
			file.put(c);
			address += word_size;
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}